

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_f5ee20::HandleFilesMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  MessageType t;
  cmExecutionStatus *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  PolicyStatus PVar4;
  const_reference pvVar5;
  reference args_00;
  string *psVar6;
  ulong uVar7;
  size_type sVar8;
  size_type sVar9;
  char *modeName;
  cmGlobalGenerator *pcVar10;
  reference filename;
  ostream *poVar11;
  PolicyID id;
  string_view name;
  unique_ptr<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>_> local_5c0;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_5b8;
  string local_5b0;
  undefined1 local_590 [8];
  string destination;
  string local_550;
  string local_530;
  MessageType local_50c;
  undefined1 local_508 [4];
  MessageType messageType;
  ostringstream e;
  char *local_390;
  char *modal;
  string *file;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmGlobalGenerator *gg;
  undefined1 local_358 [4];
  PolicyStatus policyStatus;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filesVector;
  undefined1 local_2f8 [8];
  string type;
  string local_2d0;
  ParseResult local_2b0;
  undefined1 local_280 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  undefined1 local_258 [8];
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  files;
  string local_230;
  undefined1 local_210 [8];
  cmInstallCommandArguments ica;
  undefined1 local_50 [7];
  bool programs;
  Helper helper;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  helper.DefaultComponentName.field_2._8_8_ = status;
  Helper::Helper((Helper *)local_50,status);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,0);
  ica.DefaultComponentName.field_2._M_local_buf[0xf] = std::operator==(pvVar5,"PROGRAMS");
  std::__cxx11::string::string((string *)&local_230,(string *)&helper.Makefile);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_210,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  ArgumentParser::
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::MaybeEmpty((MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_258);
  if ((ica.DefaultComponentName.field_2._M_local_buf[0xf] & 1U) == 0) {
    name = (string_view)::cm::operator____s("FILES",5);
  }
  else {
    name = (string_view)::cm::operator____s("PROGRAMS",8);
  }
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)name._M_len;
  cmArgumentParser<void>::
  Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((cmArgumentParser<void> *)local_210,(static_string_view)name,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_280);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_2b0,(cmArgumentParser<void> *)local_210,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_280,0);
  ArgumentParser::ParseResult::~ParseResult(&local_2b0);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_280);
  uVar2 = helper.DefaultComponentName.field_2._8_8_;
  if (!bVar3) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    args_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_280,0);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[26],std::__cxx11::string&,char_const(&)[3]>
              (&local_2d0,pvVar5,(char (*) [26])0x1259b85,args_00,(char (*) [3])0x123898a);
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    args_local._7_1_ = 0;
    type.field_2._12_4_ = 1;
    goto LAB_008114da;
  }
  psVar6 = cmInstallCommandArguments::GetType_abi_cxx11_((cmInstallCommandArguments *)local_210);
  std::__cxx11::string::string((string *)local_2f8,(string *)psVar6);
  uVar7 = std::__cxx11::string::empty();
  if (((uVar7 & 1) == 0) &&
     (sVar8 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(anonymous_namespace)::allowedTypes_abi_cxx11_,(key_type *)local_2f8),
     uVar2 = helper.DefaultComponentName.field_2._8_8_, sVar8 == 0)) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[18],std::__cxx11::string&,char_const(&)[22]>
              ((string *)&filesVector,pvVar5,(char (*) [18])" given non-type \"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
               (char (*) [22])"\" with TYPE argument.");
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,(string *)&filesVector);
    std::__cxx11::string::~string((string *)&filesVector);
    args_local._7_1_ = 0;
    type.field_2._12_4_ = 1;
  }
  else {
    bVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_258);
    if (bVar3) {
      args_local._7_1_ = 1;
      type.field_2._12_4_ = 1;
    }
    else {
      cmInstallCommandArguments::GetRename_abi_cxx11_((cmInstallCommandArguments *)local_210);
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) &&
         (sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_258), uVar2 = helper.DefaultComponentName.field_2._8_8_, 1 < sVar9
         )) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        cmStrCat<std::__cxx11::string_const&,char_const(&)[46]>
                  ((string *)
                   &absFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar5,
                   (char (*) [46])" given RENAME option with more than one file.");
        cmExecutionStatus::SetError
                  ((cmExecutionStatus *)uVar2,
                   (string *)
                   &absFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &absFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        args_local._7_1_ = 0;
        type.field_2._12_4_ = 1;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_358);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](args,0);
        modeName = (char *)std::__cxx11::string::c_str();
        bVar3 = Helper::MakeFilesFullPath
                          ((Helper *)local_50,modeName,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_258,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_358);
        if (bVar3) {
          PVar4 = cmMakefile::GetPolicyStatus((cmMakefile *)helper.Status,CMP0062,false);
          pcVar10 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          __end1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_258);
          file = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_258);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&file), bVar3) {
            filename = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&__end1);
            bVar3 = cmGlobalGenerator::IsExportedTargetsFile(pcVar10,filename);
            if (bVar3) {
              local_390 = (char *)0x0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_508);
              local_50c = AUTHOR_WARNING;
              if (PVar4 != OLD) {
                if (PVar4 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_530,(cmPolicies *)0x3e,id);
                  poVar11 = std::operator<<((ostream *)local_508,(string *)&local_530);
                  std::operator<<(poVar11,"\n");
                  std::__cxx11::string::~string((string *)&local_530);
                  local_390 = "should";
                }
                else if (PVar4 - NEW < 3) {
                  local_390 = "may";
                  local_50c = FATAL_ERROR;
                }
              }
              if (local_390 == (char *)0x0) {
LAB_0081117a:
                type.field_2._12_4_ = 0;
              }
              else {
                poVar11 = std::operator<<((ostream *)local_508,"The file\n  ");
                poVar11 = std::operator<<(poVar11,(string *)filename);
                poVar11 = std::operator<<(poVar11,"\nwas generated by the export() command.  It ");
                poVar11 = std::operator<<(poVar11,local_390);
                std::operator<<(poVar11,
                                " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                               );
                pcVar1 = helper.Status;
                t = local_50c;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage((cmMakefile *)pcVar1,t,&local_550);
                std::__cxx11::string::~string((string *)&local_550);
                if (local_50c != FATAL_ERROR) goto LAB_0081117a;
                args_local._7_1_ = 0;
                type.field_2._12_4_ = 1;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_508);
              if (type.field_2._12_4_ != 0) goto LAB_008114a2;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end1);
          }
          bVar3 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_210);
          if (bVar3) {
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              cmInstallCommandArguments::GetDestination_abi_cxx11_
                        ((cmInstallCommandArguments *)local_210);
              uVar7 = std::__cxx11::string::empty();
              uVar2 = helper.DefaultComponentName.field_2._8_8_;
              if ((uVar7 & 1) == 0) {
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,0);
                cmStrCat<std::__cxx11::string_const&,char_const(&)[70]>
                          ((string *)((long)&destination.field_2 + 8),pvVar5,
                           (char (*) [70])
                           " given both TYPE and DESTINATION arguments. You may only specify one.");
                cmExecutionStatus::SetError
                          ((cmExecutionStatus *)uVar2,(string *)((long)&destination.field_2 + 8));
                std::__cxx11::string::~string((string *)(destination.field_2._M_local_buf + 8));
                args_local._7_1_ = 0;
                type.field_2._12_4_ = 1;
                goto LAB_008114a2;
              }
            }
            Helper::GetDestinationForType
                      ((string *)local_590,(Helper *)local_50,(cmInstallCommandArguments *)local_210
                       ,(string *)local_2f8);
            uVar7 = std::__cxx11::string::empty();
            uVar2 = helper.DefaultComponentName.field_2._8_8_;
            pcVar1 = helper.Status;
            bVar3 = (uVar7 & 1) != 0;
            if (bVar3) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,0);
              cmStrCat<std::__cxx11::string_const&,char_const(&)[23]>
                        (&local_5b0,pvVar5,(char (*) [23])" given no DESTINATION!");
              cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_5b0);
              std::__cxx11::string::~string((string *)&local_5b0);
            }
            else {
              CreateInstallFilesGenerator
                        ((anon_unknown_dwarf_f5ee20 *)&local_5c0,(cmMakefile *)helper.Status,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_358,(cmInstallCommandArguments *)local_210,
                         (bool)(ica.DefaultComponentName.field_2._M_local_buf[0xf] & 1),
                         (string *)local_590);
              std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
              unique_ptr<cmInstallFilesGenerator,std::default_delete<cmInstallFilesGenerator>,void>
                        ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
                         &local_5b8,&local_5c0);
              cmMakefile::AddInstallGenerator((cmMakefile *)pcVar1,&local_5b8);
              std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
              ~unique_ptr(&local_5b8);
              std::
              unique_ptr<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>_>::
              ~unique_ptr(&local_5c0);
              pcVar10 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
              psVar6 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                                 ((cmInstallCommandArguments *)local_210);
              cmGlobalGenerator::AddInstallComponent(pcVar10,psVar6);
            }
            args_local._7_1_ = !bVar3;
            type.field_2._12_4_ = 1;
            std::__cxx11::string::~string((string *)local_590);
          }
          else {
            args_local._7_1_ = 0;
            type.field_2._12_4_ = 1;
          }
        }
        else {
          args_local._7_1_ = 0;
          type.field_2._12_4_ = 1;
        }
LAB_008114a2:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_358);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_2f8);
LAB_008114da:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_280);
  ArgumentParser::
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~MaybeEmpty((MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_258);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_210);
  Helper::~Helper((Helper *)local_50);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleFilesMode(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(helper.DefaultComponentName);
  ArgumentParser::MaybeEmpty<std::vector<std::string>> files;
  ica.Bind(programs ? "PROGRAMS"_s : "FILES"_s, files);
  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  std::string type = ica.GetType();
  if (!type.empty() && allowedTypes.count(type) == 0) {
    status.SetError(
      cmStrCat(args[0], " given non-type \"", type, "\" with TYPE argument."));
    return false;
  }

  const std::vector<std::string>& filesVector = files;

  // Check if there is something to do.
  if (filesVector.empty()) {
    return true;
  }

  if (!ica.GetRename().empty() && filesVector.size() > 1) {
    // The rename option works only with one file.
    status.SetError(
      cmStrCat(args[0], " given RENAME option with more than one file."));
    return false;
  }

  std::vector<std::string> absFiles;
  if (!helper.MakeFilesFullPath(args[0].c_str(), filesVector, absFiles)) {
    return false;
  }

  cmPolicies::PolicyStatus policyStatus =
    helper.Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator* gg = helper.Makefile->GetGlobalGenerator();
  for (std::string const& file : filesVector) {
    if (gg->IsExportedTargetsFile(file)) {
      const char* modal = nullptr;
      std::ostringstream e;
      MessageType messageType = MessageType::AUTHOR_WARNING;

      switch (policyStatus) {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = MessageType::FATAL_ERROR;
          break;
      }
      if (modal) {
        e << "The file\n  " << file
          << "\nwas generated by the export() "
             "command.  It "
          << modal
          << " not be installed with the "
             "install() command.  Use the install(EXPORT) mechanism "
             "instead.  See the cmake-packages(7) manual for more.\n";
        helper.Makefile->IssueMessage(messageType, e.str());
        if (messageType == MessageType::FATAL_ERROR) {
          return false;
        }
      }
    }
  }

  if (!ica.Finalize()) {
    return false;
  }

  if (!type.empty() && !ica.GetDestination().empty()) {
    status.SetError(cmStrCat(args[0],
                             " given both TYPE and DESTINATION arguments. "
                             "You may only specify one."));
    return false;
  }

  std::string destination = helper.GetDestinationForType(&ica, type);
  if (destination.empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Create the files install generator.
  helper.Makefile->AddInstallGenerator(CreateInstallFilesGenerator(
    helper.Makefile, absFiles, ica, programs, destination));

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
    ica.GetComponent());

  return true;
}